

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::IsAnyMessage(Descriptor *descriptor,Options *options)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = std::__cxx11::string::compare(*(char **)(descriptor + 8));
  if (iVar1 == 0) {
    iVar1 = std::__cxx11::string::compare((char *)**(undefined8 **)(descriptor + 0x10));
    bVar2 = iVar1 == 0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool IsAnyMessage(const Descriptor* descriptor, const Options& options) {
  return descriptor->name() == kAnyMessageName &&
         IsAnyMessage(descriptor->file(), options);
}